

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsortfilterproxymodel.cpp
# Opt level: O1

bool __thiscall
QSortFilterProxyModel::insertRows(QSortFilterProxyModel *this,int row,int count,QModelIndex *parent)

{
  QSortFilterProxyModelPrivate *this_00;
  Span *pSVar1;
  long lVar2;
  QAbstractItemModel *pQVar3;
  ulong uVar4;
  undefined1 uVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  long in_FS_OFFSET;
  const_iterator cVar9;
  QModelIndex local_48;
  long local_28;
  
  uVar4 = (ulong)(uint)row;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (0 < count && -1 < row) {
    this_00 = *(QSortFilterProxyModelPrivate **)(this + 8);
    local_48.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    local_48.r = -0x55555556;
    local_48.c = -0x55555556;
    local_48.i._0_4_ = 0xaaaaaaaa;
    local_48.i._4_4_ = 0xaaaaaaaa;
    (**(code **)(*(long *)this + 400))(&local_48,this,parent);
    if (((-1 < parent->r) && (-1 < parent->c)) && ((parent->m).ptr != (QAbstractItemModel *)0x0)) {
      uVar5 = 0;
      if (((local_48.r < 0) || (uVar5 = 0, local_48.c < 0)) ||
         (local_48.m.ptr == (QAbstractItemModel *)0x0)) goto LAB_0048a438;
    }
    cVar9 = QSortFilterProxyModelPrivate::create_mapping(this_00,&local_48);
    pSVar1 = (cVar9.i.d)->spans;
    uVar7 = cVar9.i.bucket >> 7;
    lVar2 = *(long *)(pSVar1[uVar7].entries[pSVar1[uVar7].offsets[(uint)cVar9.i.bucket & 0x7f]].
                      storage.data + 0x18);
    if (uVar4 <= *(ulong *)(lVar2 + 0x10)) {
      if (uVar4 < *(ulong *)(lVar2 + 0x10)) {
        uVar8 = *(uint *)(*(long *)(lVar2 + 8) + uVar4 * 4);
      }
      else {
        uVar8 = *(uint *)(lVar2 + 0x40);
      }
      QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
      ::value(&(this_00->super_QAbstractProxyModelPrivate).model);
      pQVar3 = (this_00->super_QAbstractProxyModelPrivate).model.
               super_QPropertyData<QAbstractItemModel_*>.val;
      iVar6 = (*(pQVar3->super_QObject)._vptr_QObject[0x1f])
                        (pQVar3,(ulong)uVar8,(ulong)(uint)count,&local_48);
      uVar5 = (undefined1)iVar6;
      goto LAB_0048a438;
    }
  }
  uVar5 = 0;
LAB_0048a438:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (bool)uVar5;
  }
  __stack_chk_fail();
}

Assistant:

bool QSortFilterProxyModel::insertRows(int row, int count, const QModelIndex &parent)
{
    Q_D(QSortFilterProxyModel);
    if (row < 0 || count <= 0)
        return false;
    QModelIndex source_parent = mapToSource(parent);
    if (parent.isValid() && !source_parent.isValid())
        return false;
    QSortFilterProxyModelPrivate::Mapping *m = d->create_mapping(source_parent).value();
    if (row > m->source_rows.size())
        return false;
    int source_row = (row >= m->source_rows.size()
                      ? m->proxy_rows.size()
                      : m->source_rows.at(row));
    return d->model->insertRows(source_row, count, source_parent);
}